

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

bool __thiscall wabt::WastParser::ParseElemExprVarListOpt(WastParser *this,ElemExprVector *out_list)

{
  pointer pEVar1;
  pointer pEVar2;
  bool bVar3;
  Var var;
  Location LStack_e8;
  Var local_c0;
  Var local_78;
  
  LStack_e8.field_1.field_0.line = 0;
  LStack_e8.field_1._4_8_ = 0;
  LStack_e8.filename.data_ = (char *)0x0;
  LStack_e8.filename.size_._0_4_ = 0;
  LStack_e8.filename.size_._4_4_ = 0;
  Var::Var(&local_c0,0xffffffff,&LStack_e8);
  LStack_e8.field_1.field_0.line = 0;
  LStack_e8.field_1._4_8_ = 0;
  LStack_e8.filename.data_ = (char *)0x0;
  LStack_e8.filename.size_._0_4_ = 0;
  LStack_e8.filename.size_._4_4_ = 0;
  Var::Var(&local_78,0xffffffff,&LStack_e8);
  bVar3 = ParseVarOpt(this,&local_c0,&local_78);
  Var::~Var(&local_78);
  if (bVar3) {
    do {
      std::vector<wabt::ElemExpr,std::allocator<wabt::ElemExpr>>::emplace_back<wabt::Var&>
                ((vector<wabt::ElemExpr,std::allocator<wabt::ElemExpr>> *)out_list,&local_c0);
      LStack_e8.field_1.field_0.line = 0;
      LStack_e8.field_1._4_8_ = 0;
      LStack_e8.filename.data_ = (char *)0x0;
      LStack_e8.filename.size_._0_4_ = 0;
      LStack_e8.filename.size_._4_4_ = 0;
      Var::Var(&local_78,0xffffffff,&LStack_e8);
      bVar3 = ParseVarOpt(this,&local_c0,&local_78);
      Var::~Var(&local_78);
    } while (bVar3);
  }
  pEVar1 = (out_list->super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pEVar2 = (out_list->super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  Var::~Var(&local_c0);
  return pEVar1 != pEVar2;
}

Assistant:

bool WastParser::ParseElemExprVarListOpt(ElemExprVector* out_list) {
  WABT_TRACE(ParseElemExprVarListOpt);
  Var var;
  while (ParseVarOpt(&var)) {
    out_list->emplace_back(var);
  }
  return !out_list->empty();
}